

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es3fUniformApiTests.cpp
# Opt level: O2

bool __thiscall
deqp::gles3::Functional::UniformCase::getUniforms
          (UniformCase *this,
          vector<deqp::gles3::Functional::(anonymous_namespace)::VarValue,_std::allocator<deqp::gles3::Functional::(anonymous_namespace)::VarValue>_>
          *valuesDst,
          vector<deqp::gles3::Functional::UniformCase::BasicUniform,_std::allocator<deqp::gles3::Functional::UniformCase::BasicUniform>_>
          *basicUniforms,deUint32 programGL)

{
  CallLogWrapper *this_00;
  pointer str;
  uint uVar1;
  TestLog *pTVar2;
  pointer pBVar3;
  bool bVar4;
  GLint location;
  uint uVar5;
  deUint32 err;
  GLenum GVar6;
  ulong uVar7;
  int line;
  VarValue *value_00;
  long lVar8;
  char *msg;
  VarValue value;
  string queryName;
  GLint unit;
  undefined1 local_248 [4];
  GLfloat aGStack_244 [19];
  vector<deqp::gles3::Functional::UniformCase::BasicUniform,_std::allocator<deqp::gles3::Functional::UniformCase::BasicUniform>_>
  *local_1f8;
  string local_1f0;
  string local_1d0;
  undefined1 local_1b0 [8];
  ostream local_1a8;
  
  pTVar2 = ((this->super_TestCase).super_TestCase.super_TestNode.m_testCtx)->m_log;
  this_00 = &this->super_CallLogWrapper;
  bVar4 = true;
  lVar8 = 0;
  local_1f8 = basicUniforms;
  do {
    pBVar3 = (local_1f8->
             super__Vector_base<deqp::gles3::Functional::UniformCase::BasicUniform,_std::allocator<deqp::gles3::Functional::UniformCase::BasicUniform>_>
             )._M_impl.super__Vector_impl_data._M_start;
    if ((int)(((long)(local_1f8->
                     super__Vector_base<deqp::gles3::Functional::UniformCase::BasicUniform,_std::allocator<deqp::gles3::Functional::UniformCase::BasicUniform>_>
                     )._M_impl.super__Vector_impl_data._M_finish - (long)pBVar3) / 0x98) <= lVar8) {
      return bVar4;
    }
    str = pBVar3 + lVar8;
    if ((((this->super_CallLogWrapper).field_0x15 & 2) == 0) || (pBVar3[lVar8].elemNdx != 0)) {
      std::__cxx11::string::string((string *)&local_1f0,(string *)str);
    }
    else {
      beforeLast(&local_1f0,&str->name,(char)this);
    }
    location = glu::CallLogWrapper::glGetUniformLocation
                         (this_00,programGL,local_1f0._M_dataplus._M_p);
    uVar5 = glu::getDataTypeScalarSize(str->type);
    aGStack_244[0xb] = -4.3160208e+08;
    aGStack_244[0xc] = -4.3160208e+08;
    aGStack_244[0xd] = -4.3160208e+08;
    aGStack_244[0xe] = -4.3160208e+08;
    aGStack_244[7] = -4.3160208e+08;
    aGStack_244[8] = -4.3160208e+08;
    aGStack_244[9] = -4.3160208e+08;
    aGStack_244[10] = -4.3160208e+08;
    aGStack_244[3] = -4.3160208e+08;
    aGStack_244[4] = -4.3160208e+08;
    aGStack_244[5] = -4.3160208e+08;
    aGStack_244[6] = -4.3160208e+08;
    aGStack_244[1] = -4.3160208e+08;
    aGStack_244[2] = -4.3160208e+08;
    aGStack_244[0xf] = -4.3160208e+08;
    if (location == -1) {
      _local_248 = 0xcdcdcdcd00000000;
      std::
      vector<deqp::gles3::Functional::(anonymous_namespace)::VarValue,_std::allocator<deqp::gles3::Functional::(anonymous_namespace)::VarValue>_>
      ::push_back(valuesDst,(value_type *)local_248);
      if (str->isUsedInShader == true) {
        local_1b0 = (undefined1  [8])pTVar2;
        std::__cxx11::ostringstream::ostringstream((ostringstream *)&local_1a8);
        std::operator<<(&local_1a8,"// FAILURE: ");
        std::operator<<(&local_1a8,(string *)str);
        std::operator<<(&local_1a8," was used in shader, but has location -1");
        tcu::MessageBuilder::operator<<
                  ((MessageBuilder *)local_1b0,(EndMessageToken *)&tcu::TestLog::EndMessage);
        std::__cxx11::ostringstream::~ostringstream((ostringstream *)&local_1a8);
        bVar4 = false;
      }
    }
    else {
      local_248 = (undefined1  [4])str->type;
      aGStack_244[0] = -4.3160208e+08;
      if (((int)local_248 - TYPE_FLOAT < 4) ||
         ((int)local_248 - TYPE_FLOAT_MAT2 < 9 || (int)local_248 - TYPE_DOUBLE_MAT2 < 9)) {
        glu::CallLogWrapper::glGetUniformfv(this_00,programGL,location,(GLfloat *)(local_248 + 4));
        err = glu::CallLogWrapper::glGetError(this_00);
        line = 0x6d4;
        msg = "glGetUniformfv(programGL, location, &value.val.floatV[0])";
LAB_010acce5:
        glu::checkError(err,msg,
                        "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/gles3/functional/es3fUniformApiTests.cpp"
                        ,line);
      }
      else {
        if ((int)local_248 - TYPE_INT < 4) {
          glu::CallLogWrapper::glGetUniformiv(this_00,programGL,location,(GLint *)(local_248 + 4));
          err = glu::CallLogWrapper::glGetError(this_00);
          line = 0x6d6;
          msg = "glGetUniformiv(programGL, location, &value.val.intV[0])";
          goto LAB_010acce5;
        }
        if ((int)local_248 - TYPE_UINT < 4) {
          glu::CallLogWrapper::glGetUniformuiv(this_00,programGL,location,(GLuint *)(local_248 + 4))
          ;
          err = glu::CallLogWrapper::glGetError(this_00);
          line = 0x6d8;
          msg = "glGetUniformuiv(programGL, location, &value.val.uintV[0])";
          goto LAB_010acce5;
        }
        if ((int)local_248 - TYPE_BOOL < 4) {
          uVar1 = *(uint *)&(this->super_CallLogWrapper).field_0x14;
          if ((uVar1 & 0x40) == 0) {
            if ((char)uVar1 < '\0') {
              glu::CallLogWrapper::glGetUniformuiv
                        (this_00,programGL,location,(GLuint *)(local_248 + 4));
              GVar6 = glu::CallLogWrapper::glGetError(this_00);
              glu::checkError(GVar6,"glGetUniformuiv(programGL, location, &value.val.uintV[0])",
                              "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/gles3/functional/es3fUniformApiTests.cpp"
                              ,0x6e3);
              if ((int)uVar5 < 1) {
                uVar5 = 0;
              }
              for (uVar7 = 0; uVar5 != uVar7; uVar7 = uVar7 + 1) {
                local_248[uVar7 + 4] = *(int *)(local_248 + uVar7 * 4 + 4) != 0;
              }
            }
            else {
              glu::CallLogWrapper::glGetUniformfv
                        (this_00,programGL,location,(GLfloat *)(local_248 + 4));
              GVar6 = glu::CallLogWrapper::glGetError(this_00);
              glu::checkError(GVar6,"glGetUniformfv(programGL, location, &value.val.floatV[0])",
                              "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/gles3/functional/es3fUniformApiTests.cpp"
                              ,0x6e9);
              if ((int)uVar5 < 1) {
                uVar5 = 0;
              }
              for (uVar7 = 0; uVar5 != uVar7; uVar7 = uVar7 + 1) {
                local_248[uVar7 + 4] = *(float *)(local_248 + uVar7 * 4 + 4) != 0.0;
              }
            }
          }
          else {
            glu::CallLogWrapper::glGetUniformiv(this_00,programGL,location,(GLint *)(local_248 + 4))
            ;
            GVar6 = glu::CallLogWrapper::glGetError(this_00);
            glu::checkError(GVar6,"glGetUniformiv(programGL, location, &value.val.intV[0])",
                            "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/gles3/functional/es3fUniformApiTests.cpp"
                            ,0x6dd);
            if ((int)uVar5 < 1) {
              uVar5 = 0;
            }
            for (uVar7 = 0; uVar5 != uVar7; uVar7 = uVar7 + 1) {
              local_248[uVar7 + 4] = *(int *)(local_248 + uVar7 * 4 + 4) != 0;
            }
          }
        }
        else if ((int)local_248 - TYPE_SAMPLER_1D < 0x1e) {
          local_1b0._0_4_ = 0xffffffff;
          glu::CallLogWrapper::glGetUniformiv(this_00,programGL,location,(GLint *)local_1b0);
          GVar6 = glu::CallLogWrapper::glGetError(this_00);
          glu::checkError(GVar6,"glGetUniformiv(programGL, location, &unit)",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/gles3/functional/es3fUniformApiTests.cpp"
                          ,0x6f1);
          aGStack_244[0] = (GLfloat)local_1b0._0_4_;
        }
      }
      std::
      vector<deqp::gles3::Functional::(anonymous_namespace)::VarValue,_std::allocator<deqp::gles3::Functional::(anonymous_namespace)::VarValue>_>
      ::push_back(valuesDst,(value_type *)local_248);
      local_1b0 = (undefined1  [8])pTVar2;
      std::__cxx11::ostringstream::ostringstream((ostringstream *)&local_1a8);
      std::operator<<(&local_1a8,"// Got ");
      std::operator<<(&local_1a8,(string *)str);
      std::operator<<(&local_1a8," value ");
      apiVarValueStr_abi_cxx11_(&local_1d0,(Functional *)local_248,value_00);
      std::operator<<(&local_1a8,(string *)&local_1d0);
      tcu::MessageBuilder::operator<<
                ((MessageBuilder *)local_1b0,(EndMessageToken *)&tcu::TestLog::EndMessage);
      std::__cxx11::string::~string((string *)&local_1d0);
      std::__cxx11::ostringstream::~ostringstream((ostringstream *)&local_1a8);
    }
    std::__cxx11::string::~string((string *)&local_1f0);
    lVar8 = lVar8 + 1;
  } while( true );
}

Assistant:

bool UniformCase::getUniforms (vector<VarValue>& valuesDst, const vector<BasicUniform>& basicUniforms, const deUint32 programGL)
{
	TestLog&	log			= m_testCtx.getLog();
	bool		success		= true;

	for (int unifNdx = 0; unifNdx < (int)basicUniforms.size(); unifNdx++)
	{
		const BasicUniform&		uniform		= basicUniforms[unifNdx];
		const string			queryName	= m_features & FEATURE_ARRAY_FIRST_ELEM_NAME_NO_INDEX && uniform.elemNdx == 0 ? beforeLast(uniform.name, '[') : uniform.name;
		const int				location	= glGetUniformLocation(programGL, queryName.c_str());
		const int				size		= glu::getDataTypeScalarSize(uniform.type);
		VarValue				value;

		deMemset(&value, 0xcd, sizeof(value)); // Initialize to known garbage.

		if (location == -1)
		{
			value.type = glu::TYPE_INVALID;
			valuesDst.push_back(value);
			if (uniform.isUsedInShader)
			{
				log << TestLog::Message << "// FAILURE: " << uniform.name << " was used in shader, but has location -1" << TestLog::EndMessage;
				success = false;
			}
			continue;
		}

		value.type = uniform.type;

		DE_STATIC_ASSERT(sizeof(GLint) == sizeof(value.val.intV[0]));
		DE_STATIC_ASSERT(sizeof(GLuint) == sizeof(value.val.uintV[0]));
		DE_STATIC_ASSERT(sizeof(GLfloat) == sizeof(value.val.floatV[0]));

		if (glu::isDataTypeFloatOrVec(uniform.type) || glu::isDataTypeMatrix(uniform.type))
			GLU_CHECK_CALL(glGetUniformfv(programGL, location, &value.val.floatV[0]));
		else if (glu::isDataTypeIntOrIVec(uniform.type))
			GLU_CHECK_CALL(glGetUniformiv(programGL, location, &value.val.intV[0]));
		else if (glu::isDataTypeUintOrUVec(uniform.type))
			GLU_CHECK_CALL(glGetUniformuiv(programGL, location, &value.val.uintV[0]));
		else if (glu::isDataTypeBoolOrBVec(uniform.type))
		{
			if (m_features & FEATURE_BOOLEANAPITYPE_INT)
			{
				GLU_CHECK_CALL(glGetUniformiv(programGL, location, &value.val.intV[0]));
				for (int i = 0; i < size; i++)
					value.val.boolV[i] = value.val.intV[i] != 0;
			}
			else if (m_features & FEATURE_BOOLEANAPITYPE_UINT)
			{
				GLU_CHECK_CALL(glGetUniformuiv(programGL, location, &value.val.uintV[0]));
				for (int i = 0; i < size; i++)
					value.val.boolV[i] = value.val.uintV[i] != 0;
			}
			else // Default: use float.
			{
				GLU_CHECK_CALL(glGetUniformfv(programGL, location, &value.val.floatV[0]));
				for (int i = 0; i < size; i++)
					value.val.boolV[i] = value.val.floatV[i] != 0.0f;
			}
		}
		else if (glu::isDataTypeSampler(uniform.type))
		{
			GLint unit = -1;
			GLU_CHECK_CALL(glGetUniformiv(programGL, location, &unit));
			value.val.samplerV.unit = unit;
		}
		else
			DE_ASSERT(false);

		valuesDst.push_back(value);

		log << TestLog::Message << "// Got " << uniform.name << " value " << apiVarValueStr(value) << TestLog::EndMessage;
	}

	return success;
}